

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TestPartResult *this;
  internal *piVar5;
  char *pcVar6;
  ostream *poVar7;
  allocator<char> local_249;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string detail_1;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string summary_1;
  string location_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string summary;
  string location;
  TestPartResult *part;
  int local_20;
  int i;
  int skips;
  int failures;
  TestResult *result_local;
  ostream *stream_local;
  
  i = 0;
  local_20 = 0;
  for (part._4_4_ = 0; iVar3 = TestResult::total_part_count(result), part._4_4_ < iVar3;
      part._4_4_ = part._4_4_ + 1) {
    this = TestResult::GetTestPartResult(result,part._4_4_);
    bVar2 = TestPartResult::failed(this);
    if (bVar2) {
      i = i + 1;
      if ((i == 1) && (local_20 == 0)) {
        std::operator<<(stream,">\n");
      }
      piVar5 = (internal *)TestPartResult::file_name(this);
      uVar4 = TestPartResult::line_number(this);
      psVar1 = (string *)((long)&summary.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_(psVar1,piVar5,(char *)(ulong)uVar4,iVar3);
      std::operator+(&local_90,psVar1,"\n");
      pcVar6 = TestPartResult::summary(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_90,pcVar6);
      std::__cxx11::string::~string((string *)&local_90);
      poVar7 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute((string *)((long)&detail.field_2 + 8),(string *)local_70);
      poVar7 = std::operator<<(poVar7,(string *)(detail.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\" type=\"\">");
      std::__cxx11::string::~string((string *)(detail.field_2._M_local_buf + 8));
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&summary.field_2 + 8),"\n");
      pcVar6 = TestPartResult::message(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_100,pcVar6);
      std::__cxx11::string::~string((string *)&local_100);
      RemoveInvalidXmlCharacters((string *)((long)&location_1.field_2 + 8),(string *)local_e0);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&location_1.field_2 + 8));
      OutputXmlCDataSection(stream,pcVar6);
      std::__cxx11::string::~string((string *)(location_1.field_2._M_local_buf + 8));
      std::operator<<(stream,"</failure>\n");
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
    }
    else {
      bVar2 = TestPartResult::skipped(this);
      if (bVar2) {
        local_20 = local_20 + 1;
        if ((local_20 == 1) && (i == 0)) {
          std::operator<<(stream,">\n");
        }
        piVar5 = (internal *)TestPartResult::file_name(this);
        uVar4 = TestPartResult::line_number(this);
        psVar1 = (string *)((long)&summary_1.field_2 + 8);
        FormatCompilerIndependentFileLocation_abi_cxx11_(psVar1,piVar5,(char *)(ulong)uVar4,iVar3);
        std::operator+(&local_180,psVar1,"\n");
        pcVar6 = TestPartResult::summary(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,&local_180,pcVar6);
        std::__cxx11::string::~string((string *)&local_180);
        poVar7 = std::operator<<(stream,"      <skipped message=\"");
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,pcVar6,
                   (allocator<char> *)(detail_1.field_2._M_local_buf + 0xf));
        EscapeXmlAttribute(&local_1a0,&local_1c0);
        poVar7 = std::operator<<(poVar7,(string *)&local_1a0);
        std::operator<<(poVar7,"\">");
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)(detail_1.field_2._M_local_buf + 0xf));
        std::operator+(&local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&summary_1.field_2 + 8),"\n");
        pcVar6 = TestPartResult::message(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8,&local_208,pcVar6);
        std::__cxx11::string::~string((string *)&local_208);
        RemoveInvalidXmlCharacters(&local_228,(string *)local_1e8);
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(&local_228);
        OutputXmlCDataSection(stream,pcVar6);
        std::__cxx11::string::~string((string *)&local_228);
        std::operator<<(stream,"</skipped>\n");
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)(summary_1.field_2._M_local_buf + 8));
      }
    }
  }
  if (((i == 0) && (local_20 == 0)) && (iVar3 = TestResult::test_property_count(result), iVar3 == 0)
     ) {
    std::operator<<(stream," />\n");
  }
  else {
    if ((i == 0) && (local_20 == 0)) {
      std::operator<<(stream,">\n");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"      ",&local_249);
    OutputXmlTestProperties(stream,result,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::operator<<(stream,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\"" << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result, /*indent=*/"      ");
    *stream << "    </testcase>\n";
  }
}